

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  Item *this_00;
  pointer *ppcVar1;
  pointer piVar2;
  pointer pcVar3;
  iterator iVar4;
  pointer pIVar5;
  pointer pvVar6;
  short sVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  runtime_error *this_01;
  int *piVar11;
  undefined4 in_register_00000034;
  undefined8 uVar12;
  long lVar13;
  iterator iVar14;
  ulong uVar15;
  pointer pvVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar21;
  double dVar22;
  int bi;
  char buf [256];
  int ti;
  uint local_29c;
  int local_298;
  int local_294;
  undefined8 local_290;
  int local_288;
  allocator_type local_281;
  vector<char,_std::allocator<char>_> *local_280;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_278;
  int local_26c;
  vector<int,std::allocator<int>> *local_268;
  int *local_260;
  vector<int,_std::allocator<int>_> *local_258;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,std::allocator<int>> *local_248;
  vector<Item,_std::allocator<Item>_> *local_240;
  Item local_238 [3];
  int local_138 [66];
  
  uVar12 = CONCAT44(in_register_00000034,__fd);
  local_294 = (int)__buf;
  iVar9 = __isoc99_fscanf(uVar12," #INSTANCE_BEGIN#");
  if (iVar9 == 0) {
    iVar9 = __isoc99_fscanf(uVar12," $INSTANCE {");
    if (iVar9 == 0) {
      iVar9 = __isoc99_fscanf(uVar12,"%d",this);
      if (iVar9 == 1) {
        local_290 = uVar12;
        if (this->ndims < 1) {
          snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
                   ,"ndims >= 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0x6e);
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,(char *)local_238);
        }
        else {
          piVar11 = &this->nbtypes;
          if (local_294 == 1) {
            iVar9 = __isoc99_fscanf(uVar12,"%d",piVar11);
            if (iVar9 != 1) {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \"%d\", &nbtypes) == 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x71);
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,(char *)local_238);
              goto LAB_00103b23;
            }
            uVar18 = *piVar11;
            if ((int)uVar18 < 1) {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d","nbtypes >= 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x72);
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,(char *)local_238);
              goto LAB_00103b23;
            }
          }
          else {
            *piVar11 = 1;
            uVar18 = 1;
          }
          local_278 = &this->Ws;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(local_278,(ulong)uVar18);
          local_250 = &this->Cs;
          std::vector<int,_std::allocator<int>_>::resize(local_250,(long)this->nbtypes);
          local_258 = &this->Qs;
          std::vector<int,_std::allocator<int>_>::resize(local_258,(long)this->nbtypes);
          if (0 < this->nbtypes) {
            lVar19 = 0;
            do {
              std::vector<int,_std::allocator<int>_>::resize
                        ((this->Ws).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar19,(long)this->ndims);
              if (0 < this->ndims) {
                lVar13 = *(long *)&(local_278->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar19].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data;
                lVar20 = 0;
                lVar17 = 0;
                do {
                  iVar9 = __isoc99_fscanf(local_290,"%d",lVar13 + lVar20);
                  if (iVar9 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &Ws[t][d]) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x7d);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  lVar13 = *(long *)&(local_278->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar19].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data;
                  if (*(int *)(lVar13 + lVar20) < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "Ws[t][d] >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x7e);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  lVar17 = lVar17 + 1;
                  lVar20 = lVar20 + 4;
                } while (lVar17 < this->ndims);
              }
              uVar12 = local_290;
              if (local_294 == 1) {
                iVar9 = __isoc99_fscanf(local_290,"%d");
                if (iVar9 != 1) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &Cs[t]) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x81);
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_01,(char *)local_238);
                  goto LAB_00103b23;
                }
                iVar9 = __isoc99_fscanf(uVar12,"%d",
                                        (local_258->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar19);
                if (iVar9 != 1) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &Qs[t]) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x82);
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_01,(char *)local_238);
                  goto LAB_00103b23;
                }
              }
              else {
                (local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar19] = 1;
                (local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar19] = -1;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < this->nbtypes);
          }
          local_240 = &this->items;
          std::vector<Item,_std::allocator<Item>_>::_M_erase_at_end
                    (local_240,
                     (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                     super__Vector_impl_data._M_start);
          uVar12 = local_290;
          piVar2 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar2) {
            (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar2;
          }
          pcVar3 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar3) {
            (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar3;
          }
          piVar2 = (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar2) {
            (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar2;
          }
          piVar11 = &this->m;
          iVar9 = __isoc99_fscanf(local_290,"%d",piVar11);
          if (iVar9 == 1) {
            local_280 = &this->ctypes;
            local_268 = (vector<int,std::allocator<int>> *)&this->demands;
            local_260 = piVar11;
            if (0 < *piVar11) {
              local_248 = (vector<int,std::allocator<int>> *)&this->nopts;
              local_288 = 0;
              iVar9 = 0;
              do {
                if (local_294 == 1) {
                  iVar10 = __isoc99_fscanf(uVar12,"%d",local_138);
                  if (iVar10 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &ti) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x92);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  if (local_138[0] < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d","ti >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x93);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  iVar10 = __isoc99_fscanf(uVar12,"%d",&local_29c);
                  if (iVar10 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &bi) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x94);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  if ((int)local_29c < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d","bi >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x95);
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_01,(char *)local_238);
                    goto LAB_00103b23;
                  }
                  iVar4._M_current =
                       (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_268,iVar4,(int *)&local_29c);
                  }
                  else {
                    *iVar4._M_current = local_29c;
                    (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  }
                }
                else {
                  local_138[0] = 1;
                  local_29c = 0xffffffff;
                }
                iVar4._M_current =
                     (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_248,iVar4,local_138);
                }
                else {
                  *iVar4._M_current = local_138[0];
                  (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                }
                local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ = '*';
                iVar14._M_current =
                     (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                            (local_280,iVar14,(char *)local_238);
                }
                else {
                  *iVar14._M_current = '*';
                  ppcVar1 = &(this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppcVar1 = *ppcVar1 + 1;
                }
                uVar18 = 0;
                if (0 < local_138[0]) {
                  local_26c = 0;
                  do {
                    Item::Item(local_238,this->ndims);
                    std::vector<Item,_std::allocator<Item>_>::emplace_back<Item>
                              (local_240,local_238);
                    if (local_238[0].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238[0].nonzero.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                    }
                    local_250 = (vector<int,_std::allocator<int>_> *)
                                CONCAT44(local_250._4_4_,uVar18);
                    local_258 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_258._4_4_,iVar9)
                    ;
                    pvVar8 = (void *)CONCAT17(local_238[0].w.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._7_1_,
                                              CONCAT16(local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start.
                                                       _6_1_,CONCAT24(local_238[0].w.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                    if (pvVar8 != (void *)0x0) {
                      operator_delete(pvVar8);
                    }
                    pIVar5 = (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    this_00 = pIVar5 + -1;
                    iVar9 = -1;
                    if (1 < local_138[0]) {
                      iVar9 = (int)local_250;
                    }
                    pIVar5[-1].opt = iVar9;
                    local_298 = 0;
                    if (0 < this->ndims) {
                      do {
                        piVar11 = Item::operator[](this_00,local_298);
                        iVar9 = __isoc99_fscanf(uVar12,"%d",piVar11);
                        if (iVar9 != 1) {
                          snprintf((char *)local_238,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \"%d\", &item[d]) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xa9);
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,(char *)local_238);
                          goto LAB_00103b23;
                        }
                        piVar11 = Item::operator[](this_00,local_298);
                        if (*piVar11 < 0) {
                          snprintf((char *)local_238,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "item[d] >= 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xaa);
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,(char *)local_238);
                          goto LAB_00103b23;
                        }
                        piVar11 = Item::operator[](this_00,local_298);
                        if (*piVar11 != 0) {
                          iVar4._M_current =
                               pIVar5[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          if (iVar4._M_current ==
                              pIVar5[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&pIVar5[-1].nonzero,iVar4,
                                       &local_298);
                          }
                          else {
                            *iVar4._M_current = local_298;
                            pIVar5[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                          }
                        }
                        local_298 = local_298 + 1;
                      } while (local_298 < this->ndims);
                    }
                    if (pIVar5[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start ==
                        pIVar5[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      snprintf((char *)local_238,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "!item.nonzero.empty()",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xaf);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_238);
                      goto LAB_00103b23;
                    }
                    if (local_294 == 0) {
                      iVar9 = __isoc99_fscanf(uVar12,"%d",&local_29c);
                      if (iVar9 != 1) {
                        snprintf((char *)local_238,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \"%d\", &bi) == 1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xb2);
                        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_01,(char *)local_238);
                        goto LAB_00103b23;
                      }
                      if ((int)local_29c < 0) {
                        snprintf((char *)local_238,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d","bi >= 0"
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xb3);
                        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_01,(char *)local_238);
                        goto LAB_00103b23;
                      }
                      iVar4._M_current =
                           (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar4._M_current ==
                          (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  (local_268,iVar4,(int *)&local_29c);
                      }
                      else {
                        *iVar4._M_current = local_29c;
                        (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                      }
                    }
                    pIVar5[-1].demand = local_29c;
                    local_298 = 0;
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_238[0].w,(long)this->ndims,&local_298,&local_281);
                    iVar9 = this->ndims;
                    iVar10 = 0;
                    if (0 < iVar9) {
                      lVar19 = CONCAT17(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                        CONCAT16(local_238[0].w.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._6_1_,
                                                 CONCAT24(local_238[0].w.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                      pvVar6 = (this->Ws).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      uVar15 = (ulong)(uint)this->nbtypes;
                      lVar13 = 0;
                      do {
                        if (0 < (int)uVar15) {
                          iVar9 = *(int *)(lVar19 + lVar13 * 4);
                          lVar17 = 0;
                          pvVar16 = pvVar6;
                          do {
                            iVar10 = *(int *)(*(long *)&(pvVar16->
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + lVar13 * 4);
                            if (iVar9 <= iVar10) {
                              iVar9 = iVar10;
                            }
                            *(int *)(lVar19 + lVar13 * 4) = iVar9;
                            lVar17 = lVar17 + 1;
                            uVar15 = (ulong)this->nbtypes;
                            pvVar16 = pvVar16 + 1;
                          } while (lVar17 < (long)uVar15);
                          iVar9 = this->ndims;
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < iVar9);
                      iVar10 = 0;
                      if (0 < iVar9) {
                        lVar13 = 0;
                        lVar19 = CONCAT17(local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._7_1_,
                                          CONCAT16(local_238[0].w.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start._6_1_,
                                                   CONCAT24(local_238[0].w.
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                        iVar10 = 0;
                        do {
                          if (0 < *(int *)(lVar19 + lVar13 * 4)) {
                            piVar11 = Item::operator[](this_00,(int)lVar13);
                            lVar19 = CONCAT17(local_238[0].w.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._7_1_,
                                              CONCAT16(local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start.
                                                       _6_1_,CONCAT24(local_238[0].w.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                            dVar22 = round(((double)*piVar11 / (double)*(int *)(lVar19 + lVar13 * 4)
                                           ) * 10000.0);
                            iVar10 = (int)((double)iVar10 + dVar22);
                            iVar9 = this->ndims;
                          }
                          lVar13 = lVar13 + 1;
                        } while (lVar13 < iVar9);
                      }
                    }
                    if (0 < pIVar5[-1].demand) {
                      iVar9 = 0;
                      if (0 < this->nbtypes) {
                        lVar19 = 0;
                        do {
                          if (this->ndims < 1) {
LAB_00103654:
                            iVar9 = 1;
                            goto LAB_00103659;
                          }
                          lVar13 = 0;
                          while (piVar11 = Item::operator[](this_00,(int)lVar13),
                                *piVar11 <=
                                *(int *)(*(long *)&(local_278->
                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar19]
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + lVar13 * 4)) {
                            lVar13 = lVar13 + 1;
                            if (this->ndims <= lVar13) goto LAB_00103654;
                          }
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < this->nbtypes);
                        iVar9 = 0;
                      }
LAB_00103659:
                      local_26c = local_26c + iVar9;
                    }
                    pIVar5[-1].key = iVar10;
                    pIVar5[-1].type = local_288;
                    iVar9 = (int)local_258;
                    pIVar5[-1].id = (int)local_258;
                    pvVar8 = (void *)CONCAT17(local_238[0].w.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._7_1_,
                                              CONCAT16(local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start.
                                                       _6_1_,CONCAT24(local_238[0].w.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                    if (pvVar8 != (void *)0x0) {
                      operator_delete(pvVar8);
                    }
                    iVar9 = iVar9 + 1;
                    uVar18 = (int)local_250 + 1;
                    uVar12 = local_290;
                  } while ((int)uVar18 < local_138[0]);
                  uVar18 = (uint)(0 < local_26c);
                }
                if (0 < (int)local_29c && uVar18 == 0) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d","nfits >= 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xda);
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_01,(char *)local_238);
                  goto LAB_00103b23;
                }
                local_288 = local_288 + 1;
              } while (local_288 < *local_260);
            }
            iVar9 = __isoc99_fscanf(uVar12," } ;");
            if (iVar9 < 1) {
              iVar9 = __isoc99_fscanf(uVar12," $%[^{ \n]",local_238);
              if (iVar9 == 1) {
                pvVar21 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&this->method;
                local_278 = pvVar21;
                do {
                  if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_2_ == 0x45 &&
                      CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._3_1_,
                               CONCAT12(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                        CONCAT11(local_238[0].w.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                 (char)local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start)))
                      == 0x50595456) {
                    iVar9 = __isoc99_fscanf(uVar12," { %[^}, \n] } ;",local_238);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %[^}, \\n] } ;\", buf) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe2);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    this->vtype = (char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                    if (((char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start != 'C') &&
                       ((char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != 'I')) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "vtype == \'C\' || vtype == \'I\'",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe4);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                  }
                  else if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_2_ == 0x45 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x50595443) {
                    iVar9 = __isoc99_fscanf(uVar12," {");
                    if (iVar9 != 0) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" {\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe6);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    pcVar3 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish != pcVar3) {
                      (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish = pcVar3;
                    }
                    if (0 < *local_260) {
                      iVar9 = 0;
                      do {
                        uVar12 = local_290;
                        if ((iVar9 != 0) && (iVar10 = __isoc99_fscanf(local_290," ,"), iVar10 != 0))
                        {
                          snprintf((char *)local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" ,\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xe9);
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,(char *)local_138);
                          goto LAB_00103b23;
                        }
                        iVar10 = __isoc99_fscanf(uVar12," %[^}, \n]",local_238);
                        piVar11 = local_260;
                        if (iVar10 != 1) {
                          snprintf((char *)local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" %[^}, \\n]\", buf) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xea);
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,(char *)local_138);
                          goto LAB_00103b23;
                        }
                        sVar7 = CONCAT11(local_238[0].w.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._1_1_,
                                         (char)local_238[0].w.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start);
                        if (sVar7 == 0x2a) {
                          local_138[0] = CONCAT31(local_138[0]._1_3_,0x2a);
                          iVar14._M_current =
                               (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          if (iVar14._M_current !=
                              (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage) {
                            *iVar14._M_current = '*';
                            goto LAB_0010391b;
                          }
LAB_00103924:
                          std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                                    (local_280,iVar14,(char *)local_138);
                        }
                        else {
                          if (sVar7 == 0x3d) {
                            local_138[0] = CONCAT31(local_138[0]._1_3_,0x3d);
                            iVar14._M_current =
                                 (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                            if (iVar14._M_current ==
                                (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00103924;
                            *iVar14._M_current = '=';
                          }
                          else {
                            if (sVar7 != 0x3e) {
                              snprintf((char *)local_138,0x100,
                                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                       "!strcmp(buf, \"*\")",
                                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                       ,0xf0);
                              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this_01,(char *)local_138);
                              goto LAB_00103b23;
                            }
                            local_138[0] = CONCAT31(local_138[0]._1_3_,0x3e);
                            iVar14._M_current =
                                 (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                            if (iVar14._M_current ==
                                (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00103924;
                            *iVar14._M_current = '>';
                          }
LAB_0010391b:
                          ppcVar1 = &(this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish;
                          *ppcVar1 = *ppcVar1 + 1;
                        }
                        iVar9 = iVar9 + 1;
                      } while (iVar9 < *piVar11);
                    }
                    uVar12 = local_290;
                    iVar9 = __isoc99_fscanf(local_290," } ;");
                    pvVar21 = local_278;
                    if (iVar9 != 0) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" } ;\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf4);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                  }
                  else if (CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._6_1_,
                                    CONCAT21(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._4_2_,
                                             local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._3_1_)) == 0x444f48 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x4854454d) {
                    iVar9 = __isoc99_fscanf(uVar12," { %d } ;",pvVar21);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &method) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf6);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    if (*(int *)&(pvVar21->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start != -3) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "method >= MIN_METHOD && method <= MAX_METHOD",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf7);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                  }
                  else if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_2_ == 0x58 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x414c4552) {
                    local_29c = 0;
                    iVar9 = __isoc99_fscanf(uVar12," { %d } ;",&local_29c);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &trelax) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xfa);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    if (1 < local_29c) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "trelax == 0 || trelax == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xfb);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    this->relax_domains = SUB41(local_29c,0);
                  }
                  else {
                    if (CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._6_1_,
                                 CONCAT21(local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._4_2_,
                                          local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._3_1_)) != 0x595241 ||
                        CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._3_1_,
                                 CONCAT12(local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._2_1_,
                                          CONCAT11(local_238[0].w.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                   (char)local_238[0].w.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) !=
                        0x414e4942) {
                      printf("Invalid option \'%s\'!\n",local_238);
                      exit(1);
                    }
                    local_29c = 0;
                    iVar9 = __isoc99_fscanf(uVar12," { %d } ;",&local_29c);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &tbinary) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xff);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    if (1 < local_29c) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "tbinary == 0 || tbinary == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0x100);
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_01,(char *)local_138);
                      goto LAB_00103b23;
                    }
                    this->binary = SUB41(local_29c,0);
                  }
                  iVar9 = __isoc99_fscanf(uVar12," $%[^{ \n]",local_238);
                } while (iVar9 == 1);
              }
              iVar9 = __isoc99_fscanf(uVar12);
              if (iVar9 < 1) {
                uVar18 = *local_260;
                if ((int)uVar18 < 1) {
                  this->n = 0;
                }
                else {
                  lVar19 = 0;
                  do {
                    pcVar3 = (local_280->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    if (pcVar3[lVar19] == '*') {
                      pcVar3[lVar19] = '>' - (*(int *)(*(long *)local_268 + lVar19 * 4) < 2);
                      uVar18 = *local_260;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < (int)uVar18);
                  this->n = 0;
                  if (0 < (int)uVar18) {
                    lVar19 = *(long *)local_268;
                    uVar15 = 0;
                    iVar9 = 0;
                    do {
                      iVar9 = iVar9 + *(int *)(lVar19 + uVar15 * 4);
                      this->n = iVar9;
                      uVar15 = uVar15 + 1;
                    } while (uVar18 != uVar15);
                  }
                }
                uVar18 = (int)((ulong)((long)(this->items).
                                             super__Vector_base<Item,_std::allocator<Item>_>._M_impl
                                             .super__Vector_impl_data._M_finish -
                                      (long)(this->items).
                                            super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
                this->nsizes = uVar18;
                return (ulong)uVar18;
              }
              snprintf((char *)local_138,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" #INSTANCE_END#\") <= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x107);
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,(char *)local_138);
            }
            else {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" } ;\") <= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xdd);
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,(char *)local_238);
            }
          }
          else {
            snprintf((char *)local_238,0x100,
                     "AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \"%d\", &m) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                     ,0x8e);
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,(char *)local_238);
          }
        }
      }
      else {
        snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &ndims) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x6d);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,(char *)local_238);
      }
    }
    else {
      snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" $INSTANCE {\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x6c);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(char *)local_238);
    }
  }
  else {
    snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #INSTANCE_BEGIN#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6b);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(char *)local_238);
  }
LAB_00103b23:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Instance::read(FILE *fin, ftype type) {
	throw_assert(fscanf(fin, " #INSTANCE_BEGIN#") == 0);
	throw_assert(fscanf(fin, " $INSTANCE {") == 0);
	throw_assert(fscanf(fin, "%d", &ndims) == 1);
	throw_assert(ndims >= 1);

	if (type == MVP) {
		throw_assert(fscanf(fin, "%d", &nbtypes) == 1);
		throw_assert(nbtypes >= 1);
	} else {
		nbtypes = 1;
	}

	Ws.resize(nbtypes);
	Cs.resize(nbtypes);
	Qs.resize(nbtypes);
	for (int t = 0; t < nbtypes; t++) {
		Ws[t].resize(ndims);
		for (int d = 0; d < ndims; d++) {
			throw_assert(fscanf(fin, "%d", &Ws[t][d]) == 1);
			throw_assert(Ws[t][d] >= 0);
		}
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &Cs[t]) == 1);
			throw_assert(fscanf(fin, "%d", &Qs[t]) == 1);
		} else {
			Cs[t] = 1;
			Qs[t] = -1;
		}
	}

	items.clear();
	nopts.clear();
	ctypes.clear();
	demands.clear();
	int it_count = 0;
	throw_assert(fscanf(fin, "%d", &m) == 1);
	for (int it_type = 0; it_type < m; it_type++) {
		int ti, bi;
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &ti) == 1);
			throw_assert(ti >= 0);
			throw_assert(fscanf(fin, "%d", &bi) == 1);
			throw_assert(bi >= 0);
			demands.push_back(bi);
		} else {
			ti = 1;
			bi = -1;
		}
		nopts.push_back(ti);
		ctypes.push_back('*');

		int nfits = 0;
		for (int opt = 0; opt < ti; opt++) {
			items.push_back(Item(ndims));
			Item &item = items.back();
			if (ti > 1) {
				item.opt = opt;
			} else {
				item.opt = -1;
			}

			for (int d = 0; d < ndims; d++) {
				throw_assert(fscanf(fin, "%d", &item[d]) == 1);
				throw_assert(item[d] >= 0);
				if (item[d] != 0) {
					item.nonzero.push_back(d);
				}
			}
			throw_assert(!item.nonzero.empty());

			if (type == VBP) {
				throw_assert(fscanf(fin, "%d", &bi) == 1);
				throw_assert(bi >= 0);
				demands.push_back(bi);
			}
			item.demand = bi;

			int S = 0;
			std::vector<int> maxW(ndims, 0);
			for (int d = 0; d < ndims; d++) {
				for (int t = 0; t < nbtypes; t++) {
					maxW[d] = std::max(maxW[d], Ws[t][d]);
				}
			}
			for (int d = 0; d < ndims; d++) {
				if (maxW[d] > 0) {
					S += round(
							item[d] / static_cast<double>(maxW[d]) * NORM_PRECISION);
				}
			}
			if (item.demand > 0) {
				bool fits = false;
				for (int t = 0; t < nbtypes; t++) {
					fits = true;
					for (int d = 0; d < ndims; d++) {
						if (item[d] > Ws[t][d]) {
							fits = false;
							break;
						}
					}
					if (fits) {
						break;
					}
				}
				nfits += fits;
			}
			item.key = S;
			item.type = it_type;
			item.id = it_count++;
		}
		if (bi > 0) {
			throw_assert(nfits >= 1);
		}
	}
	throw_assert(fscanf(fin, " } ;") <= 0);

	char buf[MAX_LEN];
	while (fscanf(fin, " $%[^{ \n]", buf) == 1) {
		if (!strcmp(buf, "VTYPE")) {
			throw_assert(fscanf(fin, " { %[^}, \n] } ;", buf) == 1);
			vtype = buf[0];
			throw_assert(vtype == 'C' || vtype == 'I');
		} else if (!strcmp(buf, "CTYPE")) {
			throw_assert(fscanf(fin, " {") == 0);
			ctypes.clear();
			for (int i = 0; i < m; i++) {
				if (i) throw_assert(fscanf(fin, " ,") == 0);
				throw_assert(fscanf(fin, " %[^}, \n]", buf) == 1);
				if (!strcmp(buf, ">")) {
					ctypes.push_back('>');
				} else if (!strcmp(buf, "=")) {
					ctypes.push_back('=');
				} else {
					throw_assert(!strcmp(buf, "*"));
					ctypes.push_back('*');
				}
			}
			throw_assert(fscanf(fin, " } ;") == 0);
		} else if (!strcmp(buf, "METHOD")) {
			throw_assert(fscanf(fin, " { %d } ;", &method) == 1);
			throw_assert(method >= MIN_METHOD && method <= MAX_METHOD);
		} else if (!strcmp(buf, "RELAX")) {
			int trelax = 0;
			throw_assert(fscanf(fin, " { %d } ;", &trelax) == 1);
			throw_assert(trelax == 0 || trelax == 1);
			relax_domains = trelax;
		} else if (!strcmp(buf, "BINARY")) {
			int tbinary = 0;
			throw_assert(fscanf(fin, " { %d } ;", &tbinary) == 1);
			throw_assert(tbinary == 0 || tbinary == 1);
			binary = tbinary;
		} else {
			printf("Invalid option '%s'!\n", buf);
			exit(1);
		}
	}
	throw_assert(fscanf(fin, " #INSTANCE_END#") <= 0);

	for (int i = 0; i < m; i++) {
		if (ctypes[i] == '*') {
			ctypes[i] = (demands[i] <= 1) ? '=' : '>';
		}
	}

	n = 0;
	for (int i = 0; i < m; i++) {
		n += demands[i];
	}

	nsizes = items.size();
}